

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O2

int __thiscall Fl_Button::value(Fl_Button *this,int v)

{
  uint *puVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = v != 0;
  this->oldval = bVar3;
  puVar1 = &(this->super_Fl_Widget).flags_;
  *(byte *)puVar1 = (byte)*puVar1 & 0x7f;
  iVar2 = 0;
  if ((int)this->value_ != (uint)bVar3) {
    this->value_ = bVar3;
    if ((this->super_Fl_Widget).box_ == '\0') {
      Fl_Widget::redraw_label(&this->super_Fl_Widget);
    }
    else {
      Fl_Widget::redraw(&this->super_Fl_Widget);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Fl_Button::value(int v) {
  v = v ? 1 : 0;
  oldval = v;
  clear_changed();
  if (value_ != v) {
    value_ = v;
    if (box()) redraw();
    else redraw_label();
    return 1;
  } else {
    return 0;
  }
}